

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Cluster::CreateBlockGroup
          (Cluster *this,longlong start_offset,longlong size,longlong discard_padding)

{
  long *plVar1;
  IMkvReader *pReader;
  BlockEntry **ppBVar2;
  bool bVar3;
  Cluster *pCluster;
  longlong lVar4;
  longlong size_00;
  BlockGroup *this_00;
  longlong lVar5;
  long lVar6;
  longlong lVar7;
  long lVar8;
  ulong unaff_R15;
  longlong local_80;
  longlong local_78;
  long local_70;
  longlong local_60;
  long len;
  longlong local_50;
  longlong local_48;
  Cluster *local_40;
  longlong time;
  
  pReader = this->m_pSegment->m_pReader;
  lVar6 = size + start_offset;
  local_80 = 1;
  local_60 = -1;
  local_78 = 0;
  local_70 = -1;
  local_50 = -1;
  local_48 = discard_padding;
  local_40 = this;
  do {
    pCluster = local_40;
    if (lVar6 <= start_offset) {
      if (local_70 < 0) {
        return -2;
      }
      if (start_offset != lVar6) {
        return -2;
      }
      ppBVar2 = local_40->m_entries;
      lVar6 = local_40->m_entries_count;
      this_00 = (BlockGroup *)operator_new(0x68,(nothrow_t *)&std::nothrow);
      if (this_00 == (BlockGroup *)0x0) {
        this_00 = (BlockGroup *)0x0;
      }
      else {
        BlockGroup::BlockGroup
                  (this_00,pCluster,lVar6,local_70,local_60,local_80,local_78,local_50,local_48);
      }
      ppBVar2[lVar6] = &this_00->super_BlockEntry;
      if (this_00 != (BlockGroup *)0x0) {
        lVar8 = BlockGroup::Parse(this_00);
        if (lVar8 != 0) {
          if (ppBVar2[lVar6] != (BlockEntry *)0x0) {
            (*ppBVar2[lVar6]->_vptr_BlockEntry[1])();
          }
          ppBVar2[lVar6] = (BlockEntry *)0x0;
          return lVar8;
        }
        plVar1 = &pCluster->m_entries_count;
        *plVar1 = *plVar1 + 1;
        return 0;
      }
      return -1;
    }
    lVar4 = ReadID(pReader,start_offset,&len);
    if ((lVar4 < 0) || (lVar8 = len + start_offset, lVar6 < lVar8)) {
      bVar3 = false;
      unaff_R15 = 0xfffffffffffffffe;
    }
    else {
      size_00 = ReadUInt(pReader,lVar8,&len);
      start_offset = lVar8 + len;
      lVar5 = local_80;
      lVar7 = local_78;
      if (lVar4 == 0x9b) {
        if ((8 < size_00) ||
           (local_50 = UnserializeUInt(pReader,start_offset,size_00), local_50 < 0)) {
LAB_0016450b:
          bVar3 = false;
          unaff_R15 = 0xfffffffffffffffe;
          goto LAB_00164510;
        }
      }
      else if (lVar4 == 0xfb) {
        if (size_00 - 9U < 0xfffffffffffffff8) goto LAB_0016450b;
        lVar8 = UnserializeInt(pReader,start_offset,size_00,&time);
        lVar5 = time;
        if (0 < time) {
          lVar5 = local_80;
          lVar7 = time;
        }
        bVar3 = false;
        unaff_R15 = -(ulong)(lVar8 != 0) | unaff_R15;
        if (lVar8 != 0) goto LAB_00164510;
      }
      else if ((lVar4 == 0xa1) && (local_70 < 0)) {
        local_70 = start_offset;
        local_60 = size_00;
      }
      start_offset = start_offset + size_00;
      if (lVar6 < start_offset) {
        unaff_R15 = 0xfffffffffffffffe;
      }
      bVar3 = start_offset <= lVar6;
      local_80 = lVar5;
      local_78 = lVar7;
    }
LAB_00164510:
    if (!bVar3) {
      return unaff_R15;
    }
  } while( true );
}

Assistant:

long Cluster::CreateBlockGroup(long long start_offset, long long size,
                               long long discard_padding) {
  assert(m_entries);
  assert(m_entries_size > 0);
  assert(m_entries_count >= 0);
  assert(m_entries_count < m_entries_size);

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = start_offset;
  const long long stop = start_offset + size;

  // For WebM files, there is a bias towards previous reference times
  //(in order to support alt-ref frames, which refer back to the previous
  // keyframe).  Normally a 0 value is not possible, but here we tenatively
  // allow 0 as the value of a reference frame, with the interpretation
  // that this is a "previous" reference time.

  long long prev = 1;  // nonce
  long long next = 0;  // nonce
  long long duration = -1;  // really, this is unsigned

  long long bpos = -1;
  long long bsize = -1;

  while (pos < stop) {
    long len;
    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);  // TODO
    assert((pos + len) <= stop);

    pos += len;  // consume size

    if (id == libwebm::kMkvBlock) {
      if (bpos < 0) {  // Block ID
        bpos = pos;
        bsize = size;
      }
    } else if (id == libwebm::kMkvBlockDuration) {
      if (size > 8)
        return E_FILE_FORMAT_INVALID;

      duration = UnserializeUInt(pReader, pos, size);

      if (duration < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvReferenceBlock) {
      if (size > 8 || size <= 0)
        return E_FILE_FORMAT_INVALID;
      const long size_ = static_cast<long>(size);

      long long time;

      long status = UnserializeInt(pReader, pos, size_, time);
      assert(status == 0);
      if (status != 0)
        return -1;

      if (time <= 0)  // see note above
        prev = time;
      else
        next = time;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }
  if (bpos < 0)
    return E_FILE_FORMAT_INVALID;

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  assert(bsize >= 0);

  const long idx = m_entries_count;

  BlockEntry** const ppEntry = m_entries + idx;
  BlockEntry*& pEntry = *ppEntry;

  pEntry = new (std::nothrow)
      BlockGroup(this, idx, bpos, bsize, prev, next, duration, discard_padding);

  if (pEntry == NULL)
    return -1;  // generic error

  BlockGroup* const p = static_cast<BlockGroup*>(pEntry);

  const long status = p->Parse();

  if (status == 0) {  // success
    ++m_entries_count;
    return 0;
  }

  delete pEntry;
  pEntry = 0;

  return status;
}